

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O1

int xmlCharEncFirstLine(xmlCharEncodingHandler *handler,xmlBufferPtr out,xmlBufferPtr in)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int in_R9D;
  int written;
  int toconv;
  int local_38;
  uint local_34;
  
  iVar1 = -1;
  if (in != (xmlBufferPtr)0x0 &&
      (out != (xmlBufferPtr)0x0 && handler != (xmlCharEncodingHandler *)0x0)) {
    local_38 = ~out->use + out->size;
    local_34 = 0xb4;
    if ((int)in->use < 0xb4) {
      local_34 = in->use;
    }
    if (local_38 <= (int)(local_34 * 2)) {
      xmlBufferGrow(out,local_34 * 2);
      local_38 = ~out->use + out->size;
    }
    iVar1 = xmlEncInputChunk(handler,out->content + out->use,&local_38,in->content,(int *)&local_34,
                             in_R9D);
    xmlBufferShrink(in,local_34);
    uVar2 = out->use + local_38;
    out->use = uVar2;
    out->content[uVar2] = '\0';
    iVar3 = -3;
    if (iVar1 != -1) {
      iVar3 = iVar1;
    }
    iVar1 = 0;
    if (iVar3 != -3) {
      iVar1 = iVar3;
    }
    if (local_38 != 0) {
      iVar1 = local_38;
    }
  }
  return iVar1;
}

Assistant:

int
xmlCharEncFirstLine(xmlCharEncodingHandler *handler, xmlBufferPtr out,
                    xmlBufferPtr in) {
    int ret;
    int written;
    int toconv;

    if (handler == NULL) return(-1);
    if (out == NULL) return(-1);
    if (in == NULL) return(-1);

    /* calculate space available */
    written = out->size - out->use - 1; /* count '\0' */
    toconv = in->use;
    /*
     * echo '<?xml version="1.0" encoding="UCS4"?>' | wc -c => 38
     * 45 chars should be sufficient to reach the end of the encoding
     * declaration without going too far inside the document content.
     * on UTF-16 this means 90bytes, on UCS4 this means 180
     * The actual value depending on guessed encoding is passed as @len
     * if provided
     */
    if (toconv > 180)
        toconv = 180;
    if (toconv * 2 >= written) {
        xmlBufferGrow(out, toconv * 2);
	written = out->size - out->use - 1;
    }

    ret = xmlEncInputChunk(handler, &out->content[out->use], &written,
                           in->content, &toconv, 0);
    xmlBufferShrink(in, toconv);
    out->use += written;
    out->content[out->use] = 0;
    if (ret == -1) ret = -3;

#ifdef DEBUG_ENCODING
    switch (ret) {
        case 0:
	    xmlGenericError(xmlGenericErrorContext,
		    "converted %d bytes to %d bytes of input\n",
	            toconv, written);
	    break;
        case -1:
	    xmlGenericError(xmlGenericErrorContext,"converted %d bytes to %d bytes of input, %d left\n",
	            toconv, written, in->use);
	    break;
        case -2:
	    xmlGenericError(xmlGenericErrorContext,
		    "input conversion failed due to input error\n");
	    break;
        case -3:
	    xmlGenericError(xmlGenericErrorContext,"converted %d bytes to %d bytes of input, %d left\n",
	            toconv, written, in->use);
	    break;
	default:
	    xmlGenericError(xmlGenericErrorContext,"Unknown input conversion failed %d\n", ret);
    }
#endif /* DEBUG_ENCODING */
    /*
     * Ignore when input buffer is not on a boundary
     */
    if (ret == -3) ret = 0;
    if (ret == -1) ret = 0;
    return(written ? written : ret);
}